

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O2

AssertionResult __thiscall
testing::internal::
CmpHelperEQ<std::experimental::fundamentals_v1::optional<int>,std::experimental::fundamentals_v1::optional<int>>
          (internal *this,char *expected_expression,char *actual_expression,optional<int> *expected,
          optional<int> *actual)

{
  bool bVar1;
  bool bVar2;
  AssertionResult AVar4;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar3
  ;
  
  bVar1 = (expected->super__Optional_base<int,_false>)._M_engaged;
  bVar2 = (actual->super__Optional_base<int,_false>)._M_engaged;
  if (bVar1 == bVar2 && bVar1 == true) {
    if ((expected->super__Optional_base<int,_false>).field_0._M_payload ==
        (actual->super__Optional_base<int,_false>).field_0._M_payload) {
LAB_0013e84f:
      AVar4 = AssertionSuccess();
      sVar3 = AVar4.message_.ptr_;
      goto LAB_0013e857;
    }
  }
  else if (bVar1 == bVar2) goto LAB_0013e84f;
  AVar4 = CmpHelperEQFailure<std::experimental::fundamentals_v1::optional<int>,std::experimental::fundamentals_v1::optional<int>>
                    (this,expected_expression,actual_expression,expected,actual);
  sVar3 = AVar4.message_.ptr_;
LAB_0013e857:
  AVar4.message_.ptr_ = sVar3.ptr_;
  AVar4._0_8_ = this;
  return AVar4;
}

Assistant:

AssertionResult CmpHelperEQ(const char* expected_expression,
                            const char* actual_expression,
                            const T1& expected,
                            const T2& actual) {
GTEST_DISABLE_MSC_WARNINGS_PUSH_(4389 /* signed/unsigned mismatch */)
  if (expected == actual) {
    return AssertionSuccess();
  }
GTEST_DISABLE_MSC_WARNINGS_POP_()

  return CmpHelperEQFailure(expected_expression, actual_expression, expected,
                            actual);
}